

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_textures(HL1MDLLoader *this)

{
  int iVar1;
  Header_HL1 *pHVar2;
  aiScene *paVar3;
  long *__src;
  aiTexture **ppaVar4;
  aiMaterial **ppaVar5;
  aiTexture *paVar6;
  aiMaterial *this_00;
  char *pKey;
  uint uVar7;
  long lVar8;
  aiColor3D *pInput;
  HL1MDLLoader *this_01;
  size_t __n;
  Texture_HL1 *ptexture;
  aiShadingMode shading_mode;
  aiColor3D last_palette_color;
  int chrome;
  aiString texture_name;
  aiPropertyTypeInfo pType;
  undefined1 local_478 [4];
  aiColor3D local_474;
  HL1MDLLoader *local_468;
  uchar *local_460;
  uint local_458;
  undefined4 uStack_454;
  ulong local_450;
  long local_448 [2];
  aiString local_434;
  
  pHVar2 = this->texture_header_;
  iVar1 = pHVar2->textureindex;
  local_460 = this->texture_buffer_;
  uVar7 = pHVar2->numtextures;
  this->scene_->mNumMaterials = uVar7;
  this->scene_->mNumTextures = uVar7;
  paVar3 = this->scene_;
  ppaVar4 = (aiTexture **)operator_new__((ulong)paVar3->mNumTextures << 3);
  paVar3->mTextures = ppaVar4;
  paVar3 = this->scene_;
  ppaVar5 = (aiMaterial **)operator_new__((ulong)paVar3->mNumMaterials << 3);
  paVar3->mMaterials = ppaVar5;
  if (0 < this->texture_header_->numtextures) {
    ptexture = (Texture_HL1 *)((pHVar2->super_HalfLifeMDLBaseHeader).ident + iVar1);
    lVar8 = 0;
    local_468 = this;
    do {
      paVar6 = (aiTexture *)operator_new(0x428);
      paVar6->mWidth = 0;
      paVar6->mHeight = 0;
      paVar6->pcData = (aiTexel *)0x0;
      (paVar6->mFilename).length = 0;
      (paVar6->mFilename).data[0] = '\0';
      this_01 = (HL1MDLLoader *)((paVar6->mFilename).data + 1);
      memset(this_01,0x1b,0x3ff);
      paVar6->achFormatHint[0] = '\0';
      paVar6->achFormatHint[1] = '\0';
      paVar6->achFormatHint[2] = '\0';
      paVar6->achFormatHint[3] = '\0';
      this->scene_->mTextures[lVar8] = paVar6;
      local_474.r = 0.0;
      local_474.g = 0.0;
      local_474.b = 0.0;
      read_texture(this_01,ptexture,local_460 + ptexture->index,
                   local_460 + ptexture->index + (long)ptexture->height * (long)ptexture->width,
                   this->scene_->mTextures[lVar8],&local_474);
      this_00 = (aiMaterial *)operator_new(0x10);
      aiMaterial::aiMaterial(this_00);
      this->scene_->mMaterials[lVar8] = this_00;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,ptexture->name,(allocator<char> *)local_478);
      __src = (long *)CONCAT44(uStack_454,local_458);
      __n = local_450 & 0xffffffff;
      if ((local_450 & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      local_434.length = (ai_uint32)__n;
      memcpy(local_434.data,__src,__n);
      local_434.data[__n] = '\0';
      if (__src != local_448) {
        operator_delete(__src,local_448[0] + 1);
      }
      aiMaterial::AddProperty(this_00,&local_434,"$tex.file",1,0);
      local_458 = (uint)ptexture->flags >> 1 & 1;
      aiMaterial::AddBinaryProperty
                (this_00,(string *)&local_458,4,"$mat.HL1.chrome",1,0,aiPTI_Integer);
      if ((ptexture->flags & 1) != 0) {
        local_478 = (undefined1  [4])0x1;
        aiMaterial::AddBinaryProperty(this_00,local_478,4,"$mat.shadingm",0,0,aiPTI_Buffer);
      }
      this = local_468;
      if ((ptexture->flags & 0x20U) == 0) {
        if ((ptexture->flags & 0x40U) != 0) {
          local_478 = (undefined1  [4])0x2;
          aiMaterial::AddBinaryProperty(this_00,local_478,4,"$tex.flags",1,0,aiPTI_Buffer);
          pType = aiPTI_Float;
          pInput = &local_474;
          uVar7 = 0xc;
          pKey = "$clr.transparent";
          goto LAB_0048d8de;
        }
      }
      else {
        local_478 = (undefined1  [4])0x1;
        pType = aiPTI_Buffer;
        pInput = (aiColor3D *)local_478;
        uVar7 = 4;
        pKey = "$mat.blend";
LAB_0048d8de:
        aiMaterial::AddBinaryProperty(this_00,pInput,uVar7,pKey,0,0,pType);
      }
      lVar8 = lVar8 + 1;
      ptexture = ptexture + 1;
    } while (lVar8 < this->texture_header_->numtextures);
  }
  return;
}

Assistant:

void HL1MDLLoader::read_textures() {
    const Texture_HL1 *ptexture = (const Texture_HL1 *)((uint8_t *)texture_header_ + texture_header_->textureindex);
    unsigned char *pin = texture_buffer_;

    scene_->mNumTextures = scene_->mNumMaterials = texture_header_->numtextures;
    scene_->mTextures = new aiTexture *[scene_->mNumTextures];
    scene_->mMaterials = new aiMaterial *[scene_->mNumMaterials];

    for (int i = 0; i < texture_header_->numtextures; ++i) {
        scene_->mTextures[i] = new aiTexture();

        aiColor3D last_palette_color;
        read_texture(&ptexture[i],
                pin + ptexture[i].index,
                pin + ptexture[i].width * ptexture[i].height + ptexture[i].index,
                scene_->mTextures[i],
                last_palette_color);

        aiMaterial *scene_material = scene_->mMaterials[i] = new aiMaterial();

        const aiTextureType texture_type = aiTextureType_DIFFUSE;
        aiString texture_name(ptexture[i].name);
        scene_material->AddProperty(&texture_name, AI_MATKEY_TEXTURE(texture_type, 0));

        // Is this a chrome texture?
        int chrome = ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_CHROME ? 1 : 0;
        scene_material->AddProperty(&chrome, 1, AI_MDL_HL1_MATKEY_CHROME(texture_type, 0));

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_FLATSHADE) {
            // Flat shading.
            const aiShadingMode shading_mode = aiShadingMode_Flat;
            scene_material->AddProperty(&shading_mode, 1, AI_MATKEY_SHADING_MODEL);
        }

        if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_ADDITIVE) {
            // Additive texture.
            const aiBlendMode blend_mode = aiBlendMode_Additive;
            scene_material->AddProperty(&blend_mode, 1, AI_MATKEY_BLEND_FUNC);
        } else if (ptexture[i].flags & AI_MDL_HL1_STUDIO_NF_MASKED) {
            // Texture with 1 bit alpha test.
            const aiTextureFlags use_alpha = aiTextureFlags_UseAlpha;
            scene_material->AddProperty(&use_alpha, 1, AI_MATKEY_TEXFLAGS(texture_type, 0));
            scene_material->AddProperty(&last_palette_color, 1, AI_MATKEY_COLOR_TRANSPARENT);
        }
    }
}